

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

PackedSlice * __thiscall kratos::VarSlice::operator[](VarSlice *this,string *member_name)

{
  char cVar1;
  int iVar2;
  uint32_t uVar3;
  undefined4 extraout_var;
  PackedSlice *pPVar4;
  long *plVar5;
  InternalException *this_00;
  UserException *pUVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  PackedStructFieldDef *local_90;
  PackedStructFieldDef *def;
  shared_ptr<kratos::PackedSlice> p;
  string local_60;
  PackedStructFieldDef *local_40;
  element_type *peStack_38;
  
  if (this->parent_var == (Var *)0x0) {
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    def = (PackedStructFieldDef *)
          &p.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::__cxx11::string::_M_construct<char_const*>((string *)&def,"Invalid var slice","");
    InternalException::InternalException(this_00,(string *)&def);
    __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = (*(this->parent_var->super_IRNode)._vptr_IRNode[0x18])();
  if ((char)iVar2 != '\0') {
    uVar3 = (*(this->super_Var).super_IRNode._vptr_IRNode[7])(this);
    if (uVar3 == (this->super_Var).var_width_) {
      iVar2 = (*(this->super_Var).super_IRNode._vptr_IRNode[0x29])(this);
      plVar5 = (long *)CONCAT44(extraout_var,iVar2);
      cVar1 = (**(code **)(*plVar5 + 0xb8))(plVar5);
      if (cVar1 == '\0') {
        pUVar6 = (UserException *)__cxa_allocate_exception(0x10);
        (*(this->super_Var).super_IRNode._vptr_IRNode[0x1f])(&local_40,this);
        p.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(member_name->_M_dataplus)._M_p;
        def = local_40;
        p.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peStack_38;
        format_str_00.size_ = 0xdd;
        format_str_00.data_ = (char *)0x1c;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)&def;
        fmt::v7::detail::vformat_abi_cxx11_
                  (&local_60,(detail *)"Invalid member access{0}.{1}",format_str_00,args_00);
        UserException::UserException(pUVar6,&local_60);
        __cxa_throw(pUVar6,&UserException::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar2 = (*(this->super_Var).super_IRNode._vptr_IRNode[0x17])(this);
      if ((char)iVar2 != '\0') {
        pPVar4 = (PackedSlice *)__dynamic_cast(this,&typeinfo,&PackedSlice::typeinfo,0);
        pPVar4 = PackedSlice::slice_member(pPVar4,member_name);
        return pPVar4;
      }
      plVar5 = (long *)__dynamic_cast(plVar5,&Var::typeinfo,&PackedInterface::typeinfo,
                                      0xfffffffffffffffe);
      if (plVar5 == (long *)0x0) {
        pUVar6 = (UserException *)__cxa_allocate_exception(0x10);
        (*(this->super_Var).super_IRNode._vptr_IRNode[0x1f])(&local_40,this);
        p.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(member_name->_M_dataplus)._M_p;
        def = local_40;
        p.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peStack_38;
        format_str_01.size_ = 0xdd;
        format_str_01.data_ = (char *)0x18;
        args_01.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args_01.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)&def;
        fmt::v7::detail::vformat_abi_cxx11_
                  (&local_60,(detail *)"Unable to access {0}.{1}",format_str_01,args_01);
        UserException::UserException(pUVar6,&local_60);
        __cxa_throw(pUVar6,&UserException::typeinfo,std::runtime_error::~runtime_error);
      }
      local_90 = (PackedStructFieldDef *)(**(code **)(*plVar5 + 8))(plVar5,member_name);
      if (local_90 != (PackedStructFieldDef *)0x0) {
        local_60._M_dataplus._M_p = (pointer)this;
        std::__shared_ptr<kratos::PackedSlice,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<std::allocator<kratos::PackedSlice>,kratos::VarSlice*,kratos::PackedStructFieldDef_const*&,std::__cxx11::string_const&>
                  ((__shared_ptr<kratos::PackedSlice,(__gnu_cxx::_Lock_policy)2> *)&def,
                   (allocator<kratos::PackedSlice> *)&local_40,(VarSlice **)&local_60,&local_90,
                   member_name);
        std::
        vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
        ::emplace_back<std::shared_ptr<kratos::PackedSlice>&>
                  ((vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
                    *)&(this->super_Var).slices_,(shared_ptr<kratos::PackedSlice> *)&def);
        if (p.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     p.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
        return (PackedSlice *)def;
      }
      pUVar6 = (UserException *)__cxa_allocate_exception(0x10);
      (*(this->super_Var).super_IRNode._vptr_IRNode[0x1f])(&local_40,this);
      p.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(member_name->_M_dataplus)._M_p;
      def = local_40;
      p.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peStack_38;
      format_str_02.size_ = 0xdd;
      format_str_02.data_ = (char *)0x18;
      args_02.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args_02.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&def;
      fmt::v7::detail::vformat_abi_cxx11_
                (&local_60,(detail *)"Unable to access {0}.{1}",format_str_02,args_02);
      UserException::UserException(pUVar6,&local_60);
      __cxa_throw(pUVar6,&UserException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  pUVar6 = (UserException *)__cxa_allocate_exception(0x10);
  (*(this->super_Var).super_IRNode._vptr_IRNode[0x1f])(&local_40,this);
  p.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(member_name->_M_dataplus)._M_p;
  def = local_40;
  p.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peStack_38;
  format_str.size_ = 0xdd;
  format_str.data_ = (char *)0x18;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&def;
  fmt::v7::detail::vformat_abi_cxx11_
            (&local_60,(detail *)"Unable to access {0}.{1}",format_str,args);
  UserException::UserException(pUVar6,&local_60);
  __cxa_throw(pUVar6,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

PackedSlice &VarSlice::operator[](const std::string &member_name) {
    if (!parent_var) throw InternalException("Invalid var slice");
    if (!parent_var->is_packed() || width() != var_width())
        throw UserException(::format("Unable to access {0}.{1}", to_string(), member_name));
    auto *root = get_var_root_parent();
    if (!root->is_struct())
        throw UserException(::format("Invalid member access{0}.{1}", to_string(), member_name));
    const PackedStructFieldDef *def;
    if (is_struct()) {
        auto *packed = dynamic_cast<PackedSlice *>(this);
        return packed->slice_member(member_name);
    } else {
        auto *packed = dynamic_cast<PackedInterface *>(root);
        if (!packed)
            throw UserException(::format("Unable to access {0}.{1}", to_string(), member_name));
        def = packed->get_definition(member_name);
    }

    if (!def) throw UserException(::format("Unable to access {0}.{1}", to_string(), member_name));
    auto p = std::make_shared<PackedSlice>(this, def, member_name);
    slices_.emplace_back(p);
    return *p;
}